

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  void *pvVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  bool bVar4;
  MixingHashState MVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  ctrl_t cVar9;
  slot_type *old_slot;
  FindInfo FVar10;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,48ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x28,0x30);
    if (local_48 != 0) {
      if (bVar4) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,void>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
                  ((HashSetResizeHelper *)&local_58.heap,common,
                   (allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>
                    *)common);
      }
      else {
        if ((char)local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        pvVar1 = (common->heap_or_soo_).heap.slot_array.p;
        old_slot = (slot_type *)CONCAT44(local_58._12_4_,local_58._8_4_);
        sVar8 = 0;
        sVar7 = local_48;
        do {
          if ((char)local_3f == '\x01') {
            __assert_fail("!was_soo_",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7be,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar8)) {
            MVar5 = hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>
                    ::combine<google::protobuf::Message_const*,std::__cxx11::string>
                              ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                               (Message **)old_slot,&(old_slot->key).second);
            FVar10 = absl::lts_20240722::container_internal::find_first_non_full<void>
                               (common,MVar5.state_);
            uVar6 = FVar10.offset;
            uVar2 = common->capacity_;
            if (uVar2 <= uVar6) {
              __assert_fail("i < c.capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x70c,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar9 = (ctrl_t)MVar5.state_ & ~kEmpty;
            pcVar3 = (common->heap_or_soo_).heap.control;
            pcVar3[uVar6] = cVar9;
            pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar6 - 0xf & uVar2)] = cVar9;
            map_slot_policy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>
            ::
            transfer<std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
                      ((allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>
                        *)common,(slot_type *)(uVar6 * 0x30 + (long)pvVar1),old_slot);
            sVar7 = local_48;
          }
          sVar8 = sVar8 + 1;
          old_slot = old_slot + 1;
        } while (sVar8 != sVar7);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x30);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }